

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avltree.h
# Opt level: O0

Node<MeshLib::Face> * __thiscall
AVL::Node<MeshLib::Face>::insert_node(Node<MeshLib::Face> *this,Face *inData)

{
  bool bVar1;
  Node<MeshLib::Face> *pNVar2;
  Face *inData_local;
  Node<MeshLib::Face> *this_local;
  
  if (this == (Node<MeshLib::Face> *)0x0) {
    this_local = (Node<MeshLib::Face> *)operator_new(0x20);
    Node(this_local,inData);
  }
  else {
    bVar1 = MeshLib::Face::operator<(inData,this->data);
    if (bVar1) {
      pNVar2 = insert_node(this->left,inData);
      this->left = pNVar2;
    }
    else {
      pNVar2 = insert_node(this->right,inData);
      this->right = pNVar2;
    }
    this_local = balance(this);
  }
  return this_local;
}

Assistant:

Node<T> * insert_node (T  *  inData)
    {
        if (this == NULL)
            return new Node<T> (inData);

        if ( *inData < *data)
            left = left -> insert_node (inData);
        else
            right = right -> insert_node (inData);
        return balance ();
    }